

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O3

bool __thiscall FPolyObj::CheckMobjBlocking(FPolyObj *this,side_t *sd)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  int iVar4;
  line_t_conflict *linedef;
  AActor *thing;
  sector_t_conflict *psVar5;
  double dVar6;
  long lVar7;
  bool bVar8;
  bool bVar9;
  ulong uVar10;
  undefined4 in_ECX;
  uint uVar11;
  long lVar12;
  FBlockNode *pFVar13;
  int iVar14;
  int iVar16;
  int iVar17;
  undefined1 auVar15 [16];
  double dVar18;
  undefined1 auVar19 [16];
  int iVar20;
  int iVar23;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  bool local_138;
  DVector2 local_f8;
  FBoundingBox local_e8;
  FLineOpening local_c8;
  
  if (CheckMobjBlocking(side_t*)::checker == '\0') {
    CheckMobjBlocking();
  }
  linedef = sd->linedef;
  iVar20 = (int)((linedef->bbox[0] - bmaporgy) * 0.0078125);
  iVar23 = (int)((linedef->bbox[1] - bmaporgy) * 0.0078125);
  if (CheckMobjBlocking::checker.Count != 0) {
    CheckMobjBlocking::checker.Count = 0;
  }
  uVar10 = CONCAT44(-(uint)(0 < iVar23),-(uint)(0 < iVar20)) & CONCAT44(iVar23,iVar20);
  iVar23 = (int)uVar10;
  iVar20 = (int)(uVar10 >> 0x20);
  auVar21._0_4_ = -(uint)(iVar23 < bmapheight);
  auVar21._4_4_ = -(uint)(iVar23 < bmapheight);
  auVar21._8_4_ = -(uint)(iVar20 < bmapheight);
  auVar21._12_4_ = -(uint)(iVar20 < bmapheight);
  uVar11 = movmskpd(in_ECX,auVar21);
  if ((uVar11 & 2) == 0) {
    iVar20 = bmapheight + -1;
  }
  if ((uVar11 & 1) == 0) {
    iVar23 = bmapheight + -1;
  }
  iVar20 = iVar20 * bmapwidth;
  if (bmapwidth * iVar23 < iVar20) {
    local_138 = false;
  }
  else {
    iVar14 = (int)((linedef->bbox[2] - bmaporgx) * 0.0078125);
    iVar16 = (int)((linedef->bbox[3] - bmaporgx) * 0.0078125);
    uVar10 = CONCAT44(-(uint)(0 < iVar16),-(uint)(0 < iVar14)) & CONCAT44(iVar16,iVar14);
    auVar15._0_8_ =
         CONCAT44(-(uint)((int)(uVar10 >> 0x20) < bmapwidth),-(uint)((int)uVar10 < bmapwidth));
    auVar15._8_8_ = 0;
    auVar19._4_4_ = bmapwidth + -1;
    auVar19._0_4_ = bmapwidth + -1;
    auVar19._8_8_ = 0;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar10 & auVar15._0_8_;
    auVar22 = ~auVar15 & auVar19 | auVar22;
    iVar16 = auVar22._0_4_;
    iVar17 = auVar22._4_4_;
    local_138 = false;
    iVar14 = bmapwidth;
    do {
      if (iVar16 <= iVar17) {
        lVar12 = (long)iVar16;
        do {
          for (pFVar13 = blocklinks[lVar12 + iVar20]; pFVar13 != (FBlockNode *)0x0;
              pFVar13 = pFVar13->NextActor) {
            thing = pFVar13->Me;
            uVar10 = (ulong)CheckMobjBlocking::checker.Count;
            do {
              if ((int)uVar10 < 1) {
                TArray<AActor_*,_AActor_*>::Grow(&CheckMobjBlocking::checker,1);
                CheckMobjBlocking::checker.Array[CheckMobjBlocking::checker.Count] = thing;
                CheckMobjBlocking::checker.Count = CheckMobjBlocking::checker.Count + 1;
                uVar11 = (thing->flags).Value;
                if ((uVar11 & 0x1002) != 2) break;
                local_c8.top = 3.4028234663852886e+38;
                local_c8.bottom = -3.4028234663852886e+38;
                if ((((((linedef->backsector == (sector_t_conflict *)0x0) ||
                       (uVar3 = linedef->flags, (uVar3 & 0x8001) != 0)) ||
                      (((uVar3 >> 0xe & 1) != 0 && (thing->player != (player_t *)0x0)))) ||
                     (((uVar3 & 2) != 0 && (((thing->flags3).Value & 0x2000) != 0)))) ||
                    (((uVar11 >> 0xe & 1) != 0 && ((uVar3 & 0x40000) != 0)))) ||
                   ((((uVar3 >> 0x15 & 1) != 0 &&
                     ((bVar8 = P_LineOpening_3dMidtex(thing,linedef,&local_c8,false), bVar8 ||
                      (local_c8.top <= (thing->__Pos).Z + thing->Height)))) &&
                    ((local_c8.abovemidtex != true ||
                     (dVar1 = (thing->__Pos).Z, dVar1 < thing->floorz || dVar1 == thing->floorz)))))
                   ) {
                  bVar8 = true;
                }
                else {
                  bVar8 = false;
                }
                iVar14 = thing->Sector->PortalGroup;
                iVar4 = linedef->frontsector->PortalGroup;
                local_e8.m_Box[2] = 0.0;
                local_e8.m_Box[1] = 0.0;
                if (iVar14 != iVar4) {
                  local_e8.m_Box[2] =
                       Displacements.data.Array[iVar4 * Displacements.size + iVar14].pos.X;
                  local_e8.m_Box[1] =
                       Displacements.data.Array[iVar4 * Displacements.size + iVar14].pos.Y;
                }
                local_e8.m_Box[2] = (thing->__Pos).X + local_e8.m_Box[2];
                local_e8.m_Box[1] = (thing->__Pos).Y + local_e8.m_Box[1];
                dVar1 = thing->radius;
                local_e8.m_Box[0] = local_e8.m_Box[1] + dVar1;
                local_e8.m_Box[3] = local_e8.m_Box[2] + dVar1;
                local_e8.m_Box[2] = local_e8.m_Box[2] - dVar1;
                local_e8.m_Box[1] = local_e8.m_Box[1] - dVar1;
                if ((((linedef->bbox[3] <= local_e8.m_Box[2]) ||
                     (local_e8.m_Box[3] < linedef->bbox[2] || local_e8.m_Box[3] == linedef->bbox[2])
                     ) || (local_e8.m_Box[0] < linedef->bbox[1] ||
                           local_e8.m_Box[0] == linedef->bbox[1])) ||
                   ((linedef->bbox[0] <= local_e8.m_Box[1] ||
                    (iVar14 = FBoundingBox::BoxOnLineSide(&local_e8,(line_t *)linedef), iVar14 != -1
                    )))) break;
                if ((linedef->portalindex < linePortals.Count) &&
                   ((linePortals.Array[linedef->portalindex].mFlags & 2) != 0)) {
                  local_f8.X = (thing->__Pos).X;
                  local_f8.Y = (thing->__Pos).Y;
                  bVar9 = P_TryMove(thing,&local_f8,0,(secplane_t *)0x0);
                  if (bVar9) break;
                }
                if (linedef->sidedef[1] == (side_t *)0x0) {
                  if (!bVar8) break;
                }
                else {
                  dVar1 = (thing->__Pos).X;
                  dVar6 = (thing->__Pos).Y;
                  dVar18 = (linedef->delta).Y * ((linedef->v1->p).X - dVar1) +
                           (linedef->delta).X * (dVar6 - (linedef->v1->p).Y);
                  if (linedef->sidedef[1.52587890625e-05 < dVar18] != sd) break;
                  if (!bVar8) {
                    dVar2 = (thing->__Pos).Z;
                    psVar5 = linedef->sidedef[dVar18 <= 1.52587890625e-05]->sector;
                    if ((((psVar5->floorplane).normal.Y * dVar6 +
                         (psVar5->floorplane).D + (psVar5->floorplane).normal.X * dVar1) *
                         (psVar5->floorplane).negiC <= dVar2) &&
                       (dVar2 + thing->Height <=
                        (dVar6 * (psVar5->ceilingplane).normal.Y +
                        (psVar5->ceilingplane).D + dVar1 * (psVar5->ceilingplane).normal.X) *
                        (psVar5->ceilingplane).negiC)) break;
                  }
                }
                ThrustMobj(this,thing,sd);
                local_138 = true;
                break;
              }
              lVar7 = uVar10 - 1;
              uVar10 = uVar10 - 1;
            } while (CheckMobjBlocking::checker.Array[lVar7] != thing);
          }
          lVar12 = lVar12 + 1;
          iVar14 = bmapwidth;
        } while (iVar17 + 1 != (int)lVar12);
      }
      iVar20 = iVar20 + iVar14;
    } while (iVar20 <= iVar14 * iVar23);
  }
  return local_138;
}

Assistant:

bool FPolyObj::CheckMobjBlocking (side_t *sd)
{
	static TArray<AActor *> checker;
	FBlockNode *block;
	AActor *mobj;
	int i, j, k;
	int left, right, top, bottom;
	line_t *ld;
	bool blocked;
	bool performBlockingThrust;

	ld = sd->linedef;

	top = GetBlockY(ld->bbox[BOXTOP]);
	bottom = GetBlockY(ld->bbox[BOXBOTTOM]);
	left = GetBlockX(ld->bbox[BOXLEFT]);
	right = GetBlockX(ld->bbox[BOXRIGHT]);

	blocked = false;
	checker.Clear();

	bottom = bottom < 0 ? 0 : bottom;
	bottom = bottom >= bmapheight ? bmapheight-1 : bottom;
	top = top < 0 ? 0 : top;
	top = top >= bmapheight  ? bmapheight-1 : top;
	left = left < 0 ? 0 : left;
	left = left >= bmapwidth ? bmapwidth-1 : left;
	right = right < 0 ? 0 : right;
	right = right >= bmapwidth ?  bmapwidth-1 : right;

	for (j = bottom*bmapwidth; j <= top*bmapwidth; j += bmapwidth)
	{
		for (i = left; i <= right; i++)
		{
			for (block = blocklinks[j+i]; block != NULL; block = block->NextActor)
			{
				mobj = block->Me;
				for (k = (int)checker.Size()-1; k >= 0; --k)
				{
					if (checker[k] == mobj)
					{
						break;
					}
				}
				if (k < 0)
				{
					checker.Push (mobj);
					if ((mobj->flags&MF_SOLID) && !(mobj->flags&MF_NOCLIP))
					{
						FLineOpening open;
						open.top = LINEOPEN_MAX;
						open.bottom = LINEOPEN_MIN;
						// [TN] Check wether this actor gets blocked by the line.
						if (ld->backsector != NULL &&
							!(ld->flags & (ML_BLOCKING|ML_BLOCKEVERYTHING))
							&& !(ld->flags & ML_BLOCK_PLAYERS && mobj->player) 
							&& !(ld->flags & ML_BLOCKMONSTERS && mobj->flags3 & MF3_ISMONSTER)
							&& !((mobj->flags & MF_FLOAT) && (ld->flags & ML_BLOCK_FLOATERS))
							&& (!(ld->flags & ML_3DMIDTEX) ||
								(!P_LineOpening_3dMidtex(mobj, ld, open) &&
									(mobj->Top() < open.top)
								) || (open.abovemidtex && mobj->Z() > mobj->floorz))
							)
						{
							// [BL] We can't just continue here since we must
							// determine if the line's backsector is going to
							// be blocked.
							performBlockingThrust = false;
						}
						else
						{
							performBlockingThrust = true;
						}

						DVector2 pos = mobj->PosRelative(ld);
						FBoundingBox box(pos.X, pos.Y, mobj->radius);

						if (!box.inRange(ld) || box.BoxOnLineSide(ld) != -1)
						{
							continue;
						}

						if (ld->isLinePortal())
						{
							// Fixme: this still needs to figure out if the polyobject move made the player cross the portal line.
							if (P_TryMove(mobj, mobj->Pos(), false))
							{
								continue;
							}
						}
						// We have a two-sided linedef so we should only check one side
						// so that the thrust from both sides doesn't cancel each other out.
						// Best use the one facing the player and ignore the back side.
						if (ld->sidedef[1] != NULL)
						{
							int side = P_PointOnLineSidePrecise(mobj->Pos(), ld);
							if (ld->sidedef[side] != sd)
							{
								continue;
							}
							// [BL] See if we hit below the floor/ceiling of the poly.
							else if(!performBlockingThrust && (
									mobj->Z() < ld->sidedef[!side]->sector->GetSecPlane(sector_t::floor).ZatPoint(mobj) ||
									mobj->Top() > ld->sidedef[!side]->sector->GetSecPlane(sector_t::ceiling).ZatPoint(mobj)
								))
							{
								performBlockingThrust = true;
							}
						}

						if(performBlockingThrust)
						{
							ThrustMobj (mobj, sd);
							blocked = true;
						}
						else
							continue;
					}
				}
			}
		}
	}
	return blocked;
}